

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer *ppPVar1;
  ushort uVar2;
  undefined4 uVar3;
  pointer pDVar4;
  double dVar5;
  uint uVar6;
  bool bVar7;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined2 uVar12;
  _Alloc_hider *p_Var13;
  _Alloc_hider _Var14;
  UINT8 UVar15;
  undefined2 uVar16;
  pointer pPVar17;
  short sVar18;
  AUDDRV_INFO *pAVar19;
  UINT8 UVar20;
  byte bVar21;
  UINT32 UVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  AUDIO_OPTS *pAVar27;
  VGMPlayer *pVVar28;
  S98Player *pSVar29;
  DROPlayer *pDVar30;
  GYMPlayer *pGVar31;
  Config *pCVar32;
  char *pcVar33;
  char *pcVar34;
  DATA_LOADER *pDVar35;
  PlayerBase *pPVar36;
  S98_HEADER *pSVar37;
  VGM_HEADER *pVVar38;
  DRO_HEADER *pDVar39;
  undefined4 extraout_var;
  vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_> *pvVar40;
  AUDIO_OPTS *pAVar41;
  void *drvObj;
  size_t sVar42;
  string *psVar43;
  UINT32 UVar44;
  char *pcVar45;
  ulong uVar46;
  char *pcVar47;
  string *psVar48;
  string *psVar49;
  size_type __new_size;
  char cVar50;
  FILE *drvStruct;
  int iVar51;
  undefined1 auVar52 [8];
  string *psVar53;
  ulong uVar54;
  char *pcVar55;
  long lVar56;
  DACSTRM_DEV *strmDev;
  UINT32 drvID;
  long *plVar57;
  bool bVar58;
  bool bVar59;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  string *local_1c8;
  char *local_1c0;
  vector<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_> diList;
  char *local_190;
  undefined1 local_180 [8];
  string result;
  AUDDRV_INFO *drvInfo;
  undefined8 uStack_d0;
  AUDDRV_INFO local_c8;
  undefined8 uStack_b8;
  INT16 aIStack_b0 [4];
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  DATA_LOADER *local_38;
  undefined4 uVar9;
  undefined3 uVar11;
  
  if (argc < 2) {
    printf("Usage: %s inputfile\n",*argv);
    return 0;
  }
  OSMutex_Init(&renderMtx,'\0');
  puts("Opening Audio Device ...");
  UVar20 = Audio_Init();
  if (UVar20 == ' ') {
    return 1;
  }
  UVar22 = Audio_GetDriverCount();
  if (UVar22 != 0) {
    iVar51 = 0;
    UVar44 = 0xffffffff;
    drvID = 0;
    do {
      Audio_GetDriverInfo(drvID,&drvInfo);
      if (drvInfo->drvType == '\x01') {
        UVar44 = drvID;
        if (iVar51 == -2) break;
        iVar51 = iVar51 + 1;
      }
      drvID = drvID + 1;
    } while (UVar22 != drvID);
    if (UVar44 != 0xffffffff) {
      audDrv = (void *)0x0;
      Audio_GetDriverInfo(UVar44,(AUDDRV_INFO **)&result);
      printf("Using driver %s.\n",*(undefined8 *)(result._M_dataplus._M_p + 8));
      UVar20 = AudioDrv_Init(UVar44,&audDrv);
      if (UVar20 == '\0') {
        audDrvLog = (void *)0x0;
        if ((audDrv != (void *)0x0) &&
           (pAVar27 = AudioDrv_GetOptions(audDrv), pAVar27 != (AUDIO_OPTS *)0x0)) {
          pAVar27->sampleRate = 0xac44;
          pAVar27->numChannels = '\x02';
          pAVar27->numBitsPerSmpl = '\x10';
          if (audDrv == (void *)0x0) {
            __new_size = 0xac44;
            UVar22 = 0x2b11;
          }
          else {
            printf("Opening Device %u ...\n");
            UVar20 = AudioDrv_Start(audDrv,0);
            if (UVar20 != '\0') {
              main_cold_2();
              goto LAB_0010ed63;
            }
            UVar22 = AudioDrv_GetBufferSize(audDrv);
            UVar22 = UVar22 >> 2;
            __new_size = 0;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&locAudBuf,__new_size);
          PlayerA::SetOutputSettings
                    (&mainPlr,pAVar27->sampleRate,pAVar27->numChannels,pAVar27->numBitsPerSmpl,
                     UVar22);
          playState = '\0';
          pVVar28 = (VGMPlayer *)operator_new(0x6a40);
          VGMPlayer::VGMPlayer(pVVar28);
          PlayerA::RegisterPlayerEngine(&mainPlr,(PlayerBase *)pVVar28);
          pSVar29 = (S98Player *)operator_new(0x1eb0);
          S98Player::S98Player(pSVar29);
          PlayerA::RegisterPlayerEngine(&mainPlr,(PlayerBase *)pSVar29);
          pDVar30 = (DROPlayer *)operator_new(0x3f8);
          DROPlayer::DROPlayer(pDVar30);
          PlayerA::RegisterPlayerEngine(&mainPlr,(PlayerBase *)pDVar30);
          pGVar31 = (GYMPlayer *)operator_new(0x330);
          GYMPlayer::GYMPlayer(pGVar31);
          PlayerA::RegisterPlayerEngine(&mainPlr,(PlayerBase *)pGVar31);
          PlayerA::SetEventCallback(&mainPlr,FilePlayCallback,(void *)0x0);
          PlayerA::SetFileReqCallback(&mainPlr,RequestFileCallback,(void *)0x0);
          PlayerA::SetLogCallback(&mainPlr,PlayerLogCallback,(void *)0x0);
          pCVar32 = PlayerA::GetConfiguration(&mainPlr);
          uVar8 = pCVar32->ignoreVolGain;
          uVar10 = pCVar32->chnInvert;
          uVar12 = *(undefined2 *)&pCVar32->field_0x6;
          uVar11 = CONCAT21(uVar12,uVar10);
          uVar9 = CONCAT31(uVar11,uVar8);
          drvInfo = (AUDDRV_INFO *)CONCAT44(uVar9,0x10000);
          uStack_d0 = 0x2b11000000002;
          local_c8._4_4_ = SUB84((ulong)*(undefined8 *)&pCVar32->endSilenceSmpls >> 0x20,0);
          local_c8._0_4_ = 0x5622;
          local_c8.drvName = (char *)0x3ff0000000000000;
          PlayerA::SetConfiguration(&mainPlr,(Config *)&drvInfo);
          auVar52 = (undefined1  [8])0x1;
          do {
            pcVar47 = argv[SUB84(auVar52,0)];
            pcVar33 = strrchr(pcVar47,0x2f);
            pcVar34 = strrchr(pcVar47,0x5c);
            if (pcVar33 < pcVar34) {
              pcVar33 = pcVar34;
            }
            pcVar34 = pcVar33 + 1;
            if (pcVar33 == (char *)0x0) {
              pcVar34 = pcVar47;
            }
            printf("Loading %s ...  ",pcVar34);
            fflush(_stdout);
            pDVar35 = FileLoader_Init(argv[SUB84(auVar52,0)]);
            if (pDVar35 != (DATA_LOADER *)0x0) {
              DataLoader_SetPreloadBytes(pDVar35,0x100);
              UVar20 = DataLoader_Load(pDVar35);
              if (UVar20 == '\0') {
                UVar20 = PlayerA::LoadFile(&mainPlr,pDVar35);
                if (UVar20 == '\0') {
                  pPVar36 = PlayerA::GetPlayer(&mainPlr);
                  PlayerA::SetLoopCount(&mainPlr,2);
                  iVar51 = (*pPVar36->_vptr_PlayerBase[2])(pPVar36);
                  local_180 = auVar52;
                  local_38 = pDVar35;
                  if (iVar51 == 0x53393800) {
                    pSVar29 = (S98Player *)
                              __dynamic_cast(pPVar36,&PlayerBase::typeinfo,&S98Player::typeinfo,0);
                    pSVar37 = S98Player::GetFileHeader(pSVar29);
                    bVar21 = pSVar37->fileVer;
                    uVar23 = (*pPVar36->_vptr_PlayerBase[0x1c])(pPVar36);
                    (*pPVar36->_vptr_PlayerBase[0x17])(pPVar36,(ulong)uVar23);
                    uVar23 = (*pPVar36->_vptr_PlayerBase[0x1d])(pPVar36);
                    (*pPVar36->_vptr_PlayerBase[0x17])(pPVar36,(ulong)uVar23);
                    printf("S98 v%u, Total Length: %.2f s, Loop Length: %.2f s, Tick Rate: %u/%u",
                           extraout_XMM0_Da,CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da_00),
                           (ulong)bVar21,(ulong)pSVar37->tickMult);
                  }
                  else {
                    iVar51 = (*pPVar36->_vptr_PlayerBase[2])(pPVar36);
                    if (iVar51 == 0x56474d00) {
                      pVVar28 = (VGMPlayer *)
                                __dynamic_cast(pPVar36,&PlayerBase::typeinfo,&VGMPlayer::typeinfo,0)
                      ;
                      pVVar38 = VGMPlayer::GetFileHeader(pVVar28);
                      uVar23 = pVVar38->fileVer;
                      uVar24 = (*pPVar36->_vptr_PlayerBase[0x1c])(pPVar36);
                      (*pPVar36->_vptr_PlayerBase[0x17])(pPVar36,(ulong)uVar24);
                      uVar24 = (*pPVar36->_vptr_PlayerBase[0x1d])(pPVar36);
                      (*pPVar36->_vptr_PlayerBase[0x17])(pPVar36,(ulong)uVar24);
                      printf("VGM v%3X, Total Length: %.2f s, Loop Length: %.2f s",
                             extraout_XMM0_Da_01,CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_02),
                             (ulong)uVar23);
                      UVar22 = VGMPlayer::GetModifiedLoopCount(pVVar28,2);
                      PlayerA::SetLoopCount(&mainPlr,UVar22);
                    }
                    else {
                      iVar51 = (*pPVar36->_vptr_PlayerBase[2])(pPVar36);
                      if (iVar51 == 0x44524f00) {
                        pDVar30 = (DROPlayer *)
                                  __dynamic_cast(pPVar36,&PlayerBase::typeinfo,&DROPlayer::typeinfo,
                                                 0);
                        pDVar39 = DROPlayer::GetFileHeader(pDVar30);
                        pcVar47 = "unknown";
                        if ((ulong)pDVar39->hwType < 3) {
                          pcVar47 = &DAT_0017668c +
                                    *(int *)(&DAT_0017668c + (ulong)pDVar39->hwType * 4);
                        }
                        uVar2 = pDVar39->verMajor;
                        uVar23 = (*pPVar36->_vptr_PlayerBase[0x1c])(pPVar36);
                        (*pPVar36->_vptr_PlayerBase[0x17])(pPVar36,(ulong)uVar23);
                        printf("DRO v%u, Total Length: %.2f s, HW Type: %s",(ulong)uVar2,pcVar47);
                      }
                    }
                  }
                  if (showTags != '\0') {
                    iVar51 = (*pPVar36->_vptr_PlayerBase[7])();
                    pcVar47 = *(char **)CONCAT44(extraout_var,iVar51);
                    if (pcVar47 != (char *)0x0) {
                      plVar57 = (long *)CONCAT44(extraout_var,iVar51) + 1;
                      pcVar33 = (char *)0x0;
                      local_1c0 = (char *)0x0;
                      local_190 = (char *)0x0;
                      pcVar45 = (char *)0x0;
                      pcVar55 = (char *)0x0;
                      pcVar34 = (char *)0x0;
                      do {
                        iVar51 = strcmp(pcVar47,"TITLE");
                        if (iVar51 == 0) {
                          pcVar33 = (char *)*plVar57;
                        }
                        else {
                          iVar51 = strcmp(pcVar47,"ARTIST");
                          if (iVar51 == 0) {
                            pcVar34 = (char *)*plVar57;
                          }
                          else {
                            iVar51 = strcmp(pcVar47,"GAME");
                            if (iVar51 == 0) {
                              pcVar55 = (char *)*plVar57;
                            }
                            else {
                              iVar51 = strcmp(pcVar47,"SYSTEM");
                              if (iVar51 == 0) {
                                pcVar45 = (char *)*plVar57;
                              }
                              else {
                                iVar51 = strcmp(pcVar47,"DATE");
                                if (iVar51 == 0) {
                                  local_190 = (char *)*plVar57;
                                }
                                else {
                                  iVar51 = strcmp(pcVar47,"COMMENT");
                                  if (iVar51 == 0) {
                                    local_1c0 = (char *)*plVar57;
                                  }
                                }
                              }
                            }
                          }
                        }
                        pcVar47 = (char *)plVar57[1];
                        plVar57 = plVar57 + 2;
                      } while (pcVar47 != (char *)0x0);
                      if ((pcVar33 != (char *)0x0) && (*pcVar33 != '\0')) {
                        printf("\nSong Title: %s",pcVar33);
                      }
                      pcVar47 = local_1c0;
                      if (1 < showTags) {
                        if ((pcVar34 != (char *)0x0) && (*pcVar34 != '\0')) {
                          printf("\nSong Author: %s",pcVar34);
                        }
                        if ((pcVar55 != (char *)0x0) && (*pcVar55 != '\0')) {
                          printf("\nSong Game: %s",pcVar55);
                        }
                        if ((pcVar45 != (char *)0x0) && (*pcVar45 != '\0')) {
                          printf("\nSong System: %s",pcVar45);
                        }
                        if ((local_190 != (char *)0x0) && (*local_190 != '\0')) {
                          printf("\nSong Date: %s",local_190);
                        }
                        if ((pcVar47 != (char *)0x0) && (*pcVar47 != '\0')) {
                          printf("\nSong Comment: %s",pcVar47);
                        }
                      }
                    }
                  }
                  putchar(10);
                  iVar51 = (*pPVar36->_vptr_PlayerBase[0xb])(pPVar36,0x80000000,&drvInfo);
                  if (-1 < (char)iVar51) {
                    if ((int)drvInfo == 0) {
                      drvInfo = (AUDDRV_INFO *)CONCAT44(drvInfo._4_4_,0x4d41584d);
                    }
                    uStack_b8 = 0x80ff800000;
                    (*pPVar36->_vptr_PlayerBase[10])(pPVar36,0x80000000,&drvInfo);
                  }
                  iVar51 = (*pPVar36->_vptr_PlayerBase[0xb])(pPVar36,0x80000001,&drvInfo);
                  if (-1 < (char)iVar51) {
                    uStack_a8 = 0xffa00000;
                    uStack_a4 = 0x60;
                    uStack_a0 = 0xc0ff40;
                    uStack_b8 = 0x80ff800100ff00;
                    aIStack_b0[0] = -0x40;
                    aIStack_b0[1] = 0x40;
                    aIStack_b0[2] = -0xc0;
                    aIStack_b0[3] = 0xc0;
                    (*pPVar36->_vptr_PlayerBase[10])(pPVar36,0x80000001,&drvInfo);
                  }
                  iVar51 = (*pPVar36->_vptr_PlayerBase[0xb])(pPVar36,0x80000012,&drvInfo);
                  if (-1 < (char)iVar51) {
                    uVar46 = (ulong)uStack_b8 >> 0x20;
                    uStack_b8 = CONCAT44((uint)uVar46 & 0xffff0000,0x80ff80);
                    (*pPVar36->_vptr_PlayerBase[10])(pPVar36,0x80000012,&drvInfo);
                  }
                  iVar51 = (*pPVar36->_vptr_PlayerBase[0xb])(pPVar36,0x8000001b,&drvInfo);
                  if (-1 < (char)iVar51) {
                    if ((int)drvInfo == 0) {
                      drvInfo = (AUDDRV_INFO *)CONCAT44(drvInfo._4_4_,0x4d414d45);
                    }
                    (*pPVar36->_vptr_PlayerBase[10])(pPVar36,0x8000001b,&drvInfo);
                  }
                  PlayerA::Start(&mainPlr);
                  if (showFileInfo == true) {
                    diList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    diList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    diList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    (*pPVar36->_vptr_PlayerBase[8])(pPVar36,&drvInfo);
                    (*pPVar36->_vptr_PlayerBase[9])(pPVar36,&diList);
                    pAVar19 = drvInfo;
                    result._M_dataplus._M_p = (pointer)&result.field_2;
                    std::__cxx11::string::_M_construct((ulong)&result,'\x04');
                    *result._M_dataplus._M_p = (char)((ulong)pAVar19 >> 0x18);
                    result._M_dataplus._M_p[1] = (char)((ulong)pAVar19 >> 0x10);
                    result._M_dataplus._M_p[2] = (char)((ulong)pAVar19 >> 8);
                    result._M_dataplus._M_p[3] = (char)pAVar19;
                    printf("SongInfo: %s v%X.%02X, Rate %u/%u, Len %u, Loop at %d, devices: %u\n",
                           result._M_dataplus._M_p,(ulong)drvInfo >> 0x20 & 0xffff,
                           (ulong)drvInfo >> 0x30,uStack_d0 & 0xffffffff,uStack_d0 >> 0x20,
                           local_c8._0_8_ & 0xffffffff,(ulong)local_c8._0_8_ >> 0x20,
                           (ulong)local_c8.drvName >> 0x20);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)result._M_dataplus._M_p != &result.field_2) {
                      operator_delete(result._M_dataplus._M_p,
                                      result.field_2._M_allocated_capacity + 1);
                    }
                    if (diList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                        _M_impl.super__Vector_impl_data._M_finish !=
                        diList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                        _M_impl.super__Vector_impl_data._M_start) {
                      lVar56 = 0x10;
                      uVar46 = 0;
                      do {
                        pPVar17 = diList.
                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        uVar23 = *(uint *)((long)diList.
                                                 super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                 ._M_impl.super__Vector_impl_data._M_start +
                                          lVar56 + -0x10);
                        local_1c0 = (char *)CONCAT44(local_1c0._4_4_,
                                                     (uint)*(byte *)((long)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar56 + -0xc));
                        cVar50 = *(char *)((long)diList.
                                                 super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                 ._M_impl.super__Vector_impl_data._M_start +
                                          lVar56 + -0xb);
                        uVar3 = *(undefined4 *)
                                 ((long)diList.
                                        super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar56 + -8);
                        result._M_dataplus._M_p = (pointer)&result.field_2;
                        std::__cxx11::string::_M_construct((ulong)&result,'\x04');
                        *result._M_dataplus._M_p = (char)((uint)uVar3 >> 0x18);
                        result._M_dataplus._M_p[1] = (char)((uint)uVar3 >> 0x10);
                        result._M_dataplus._M_p[2] = (char)((uint)uVar3 >> 8);
                        result._M_dataplus._M_p[3] = (char)uVar3;
                        printf(" Dev %d: Type 0x%02X #%d, Core %s, Clock %u, Rate %u, Volume 0x%X\n"
                               ,(ulong)uVar23,(ulong)local_1c0 & 0xffffffff,(ulong)(uint)(int)cVar50
                               ,result._M_dataplus._M_p,
                               (ulong)*(uint *)(*(long *)((long)&pPVar17->id + lVar56) + 8),
                               (ulong)*(uint *)((long)pPVar17 + lVar56 + -4),
                               (ulong)*(ushort *)((long)pPVar17 + lVar56 + -10));
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)result._M_dataplus._M_p != &result.field_2) {
                          operator_delete(result._M_dataplus._M_p,
                                          result.field_2._M_allocated_capacity + 1);
                        }
                        uVar46 = uVar46 + 1;
                        lVar56 = lVar56 + 0x18;
                      } while (uVar46 < (ulong)(((long)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                               -0x5555555555555555));
                    }
                    if (diList.super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(diList.
                                      super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)diList.
                                            super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)diList.
                                            super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                  iVar51 = (*pPVar36->_vptr_PlayerBase[2])(pPVar36);
                  if (iVar51 == 0x56474d00) {
                    pVVar28 = (VGMPlayer *)
                              __dynamic_cast(pPVar36,&PlayerBase::typeinfo,&VGMPlayer::typeinfo);
                    pvVar40 = VGMPlayer::GetStreamDevInfo(pVVar28);
                  }
                  else {
                    pvVar40 = (vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                               *)0x0;
                  }
                  if (audDrvLog != (void *)0x0) {
                    pAVar27 = AudioDrv_GetOptions(audDrvLog);
                    if (audDrv != (void *)0x0) {
                      pAVar41 = AudioDrv_GetOptions(audDrv);
                      UVar20 = pAVar41->numChannels;
                      UVar15 = pAVar41->numBitsPerSmpl;
                      uVar16 = *(undefined2 *)&pAVar41->field_0x6;
                      UVar22 = pAVar41->usecPerBuf;
                      UVar44 = pAVar41->numBuffers;
                      pAVar27->sampleRate = pAVar41->sampleRate;
                      pAVar27->numChannels = UVar20;
                      pAVar27->numBitsPerSmpl = UVar15;
                      *(undefined2 *)&pAVar27->field_0x6 = uVar16;
                      pAVar27->usecPerBuf = UVar22;
                      pAVar27->numBuffers = UVar44;
                    }
                    drvObj = AudioDrv_GetDrvData(audDrvLog);
                    WavWrt_SetFileName(drvObj,"waveOut.wav");
                    UVar20 = AudioDrv_Start(audDrvLog,0);
                    if (audDrv != (void *)0x0 && UVar20 == '\0') {
                      AudioDrv_DataForward_Add(audDrv,audDrvLog);
                    }
                  }
                  if (audDrv == (void *)0x0) {
                    bVar59 = true;
                  }
                  else {
                    UVar20 = AudioDrv_SetCallback(audDrv,FillBuffer,&mainPlr);
                    bVar59 = UVar20 != '\0';
                  }
                  drvStruct = (FILE *)0x1;
                  changemode('\x01');
                  playState = playState & 0xfd;
                  uVar23 = 1;
                  do {
                    if ((byte)((playState & 4) >> 2 & ((byte)uVar23 ^ 1)) == 0) {
                      pcVar47 = "Paused";
                      if ((playState & 4) == 0) {
                        bVar21 = PlayerA::GetState(&mainPlr);
                        pcVar47 = "Finish ";
                        if ((bVar21 & 2) == 0) {
                          bVar21 = PlayerA::GetState(&mainPlr);
                          pcVar47 = "Fading ";
                          if ((bVar21 & 0x10) == 0) {
                            pcVar47 = "Playing";
                          }
                        }
                      }
                      if ((pvVar40 ==
                           (vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                            *)0x0) ||
                         (pDVar4 = (pvVar40->
                                   super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                                   )._M_impl.super__Vector_impl_data._M_start,
                         pDVar4 == (pvVar40->
                                   super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                                   )._M_impl.super__Vector_impl_data._M_finish)) {
                        local_1c0 = (char *)PlayerA::GetCurTime(&mainPlr,pbTimeMode);
                        dVar5 = PlayerA::GetTotalTime(&mainPlr,pbTimeMode);
                        printf("%s %.2f / %.2f ...   \r",(int)local_1c0,dVar5,pcVar47);
                      }
                      else {
                        drvInfo = &local_c8;
                        std::__cxx11::string::_M_construct<char_const*>((string *)&drvInfo," ","");
                        bVar21 = pDVar4->pbMode;
                        cVar50 = (char)(string *)&drvInfo;
                        if ((bVar21 & 0x10) != 0) {
                          std::__cxx11::string::push_back(cVar50);
                          bVar21 = pDVar4->pbMode;
                        }
                        if ((char)bVar21 < '\0') {
                          std::__cxx11::string::push_back(cVar50);
                        }
                        if (uStack_d0 == 1) {
                          std::__cxx11::string::_M_replace((ulong)&drvInfo,0,(char *)0x1,0x17c7e3);
                        }
                        local_1c0 = (char *)PlayerA::GetCurTime(&mainPlr,pbTimeMode);
                        dVar5 = PlayerA::GetTotalTime(&mainPlr,pbTimeMode);
                        printf("%s %.2f / %.2f [%02X / %02X at %4.1f KHz%s] ...     \r",
                               (int)local_1c0,dVar5,(double)pDVar4->freq / 1000.0,pcVar47,
                               (ulong)(pDVar4->lastItem + 1),(ulong)pDVar4->maxItems,drvInfo);
                        if (drvInfo != &local_c8) {
                          operator_delete(drvInfo,local_c8._0_8_ + 1);
                        }
                      }
                      drvStruct = _stdout;
                      fflush(_stdout);
                    }
                    if ((bVar59) && ((playState & 4) == 0)) {
                      UVar22 = FillBuffer(drvStruct,&mainPlr,
                                          (int)locAudBuf.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                          (int)locAudBuf.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start,
                                          locAudBuf.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                      AudioDrv_WriteData(audDrvLog,UVar22,
                                         locAudBuf.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
                    }
                    else {
                      usleep(50000);
                    }
                    result._M_dataplus._M_p = (pointer)0x0;
                    result._M_string_length = 0;
                    local_70 = 0;
                    uStack_68 = 0;
                    local_80 = 0;
                    uStack_78 = 0;
                    local_90 = 0;
                    uStack_88 = 0;
                    uStack_a0 = 0;
                    uStack_9c = 0;
                    uStack_98 = 0;
                    aIStack_b0[0] = 0;
                    aIStack_b0[1] = 0;
                    aIStack_b0[2] = 0;
                    aIStack_b0[3] = 0;
                    uStack_a8 = 0;
                    uStack_a4 = 0;
                    local_c8.drvName = (char *)0x0;
                    uStack_b8 = 0;
                    uStack_d0 = 0;
                    local_c8.drvType = '\0';
                    local_c8.drvSig = '\0';
                    local_c8._2_6_ = 0;
                    local_60 = 0;
                    drvInfo = (AUDDRV_INFO *)0x1;
                    drvStruct = (FILE *)0x1;
                    select(1,(fd_set *)&drvInfo,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&result);
                    uVar23 = (uint)drvInfo & 1;
                    if (((ulong)drvInfo & 1) == 0) goto LAB_0010dca0;
                    uVar24 = getchar();
                    drvStruct = (FILE *)(ulong)uVar24;
                    uVar25 = toupper(uVar24);
                    if (uVar25 == 0x20) {
LAB_0010db9f:
                      playState = playState ^ 4;
                      drvStruct = (FILE *)audDrv;
                      if (audDrv != (void *)0x0) {
                        if ((playState & 4) == 0) {
                          AudioDrv_Resume(audDrv);
                        }
                        else {
                          AudioDrv_Pause(audDrv);
                        }
                      }
                    }
                    else if (uVar25 == 0x52) {
                      OSMutex_Lock(renderMtx);
                      PlayerA::Reset(&mainPlr);
LAB_0010dc2e:
                      drvStruct = (FILE *)renderMtx;
                      OSMutex_Unlock(renderMtx);
                    }
                    else {
                      if (uVar25 == 0x50) goto LAB_0010db9f;
                      if (uVar25 - 0x30 < 10) {
                        OSMutex_Lock(renderMtx);
                        pPVar36 = PlayerA::GetPlayer(&mainPlr);
                        iVar51 = (*pPVar36->_vptr_PlayerBase[0x1e])(pPVar36,2);
                        PlayerA::Seek(&mainPlr,'\x01',((uVar25 & 0xf) * iVar51) / 10);
                        goto LAB_0010dc2e;
                      }
                      iVar51 = local_180._0_4_;
                      if (uVar25 == 0x4e) {
                        if (iVar51 + 1 < argc) {
                          playState = playState | 2;
                        }
                      }
                      else if (uVar25 == 0x42) {
                        if (1 < iVar51) {
                          uVar6 = iVar51 - 2;
LAB_0010dc9b:
                          playState = playState | 2;
                          local_180 = (undefined1  [8])(ulong)uVar6;
                        }
                      }
                      else {
                        uVar6 = argc - 1;
                        if (uVar24 == 0x1b || uVar25 == 0x51) goto LAB_0010dc9b;
                        if (uVar25 == 0x43) {
                          iVar51 = 0;
                          changemode('\0');
                          pPVar36 = PlayerA::GetPlayer(&mainPlr);
                          printf("Command Mode. ");
                          pcVar47 = (char *)0xffffffff;
LAB_0010dcfc:
                          do {
                            psVar43 = &result;
                            if (iVar51 == 1) {
                              iVar51 = (*pPVar36->_vptr_PlayerBase[0xb])(pPVar36,pcVar47,&drvInfo);
                              if ((char)iVar51 < '\0') {
                                iVar51 = 0;
                                goto LAB_0010dcfc;
                              }
                              printf("Command [C/LC/O/SRM/SR/RSM/M data]: ");
                              fgets((char *)psVar43,0x80,_stdin);
                              psVar48 = (string *)(local_180 + 7);
                              do {
                                p_Var13 = &psVar48->_M_dataplus;
                                psVar48 = (string *)((long)&(psVar48->_M_dataplus)._M_p + 1);
                              } while (*(char *)((long)&p_Var13->_M_p + 1) != '\0');
                              do {
                                psVar49 = psVar48;
                                if (psVar49 <= psVar43) break;
                                iVar51 = iscntrl((uint)(byte)psVar49[-1].field_2._M_local_buf[0xf]);
                                psVar48 = (string *)((long)&psVar49[-1].field_2 + 0xf);
                              } while (iVar51 != 0);
                              *(undefined1 *)&(psVar49->_M_dataplus)._M_p = 0;
                              strtok((char *)psVar43," ");
                              bVar21 = (byte)result._M_dataplus._M_p;
                              _Var14 = result._M_dataplus;
                              while (result._M_dataplus._M_p = _Var14._M_p, bVar21 != 0) {
                                iVar51 = toupper((uint)bVar21);
                                *(char *)&(psVar43->_M_dataplus)._M_p = (char)iVar51;
                                p_Var13 = &psVar43->_M_dataplus;
                                psVar43 = (string *)((long)&(psVar43->_M_dataplus)._M_p + 1);
                                _Var14 = result._M_dataplus;
                                bVar21 = *(byte *)((long)&p_Var13->_M_p + 1);
                              }
                              psVar48 = (string *)((long)&(psVar43->_M_dataplus)._M_p + 1);
                              result._M_dataplus._M_p._0_2_ = (short)_Var14._M_p;
                              sVar18 = (short)result._M_dataplus._M_p;
                              local_1c8 = psVar43;
                              if ((short)result._M_dataplus._M_p == 0x43) {
                                diList.
                                super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                                _M_impl.super__Vector_impl_data._M_start =
                                     (pointer)&diList.
                                               super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                sVar42 = strlen((char *)psVar48);
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&diList,psVar48,
                                           (long)&(psVar48->_M_dataplus)._M_p + sVar42);
                                std::__cxx11::string::resize((ulong)&diList,'\x04');
                                drvInfo = (AUDDRV_INFO *)
                                          CONCAT44(drvInfo._4_4_,
                                                   (int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 3
                                                  ) | (int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 2
                                                  ) << 8 | (int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 1
                                                  ) << 0x10 |
                                                  (uint)(byte)(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id <<
                                                  0x18);
                                (*pPVar36->_vptr_PlayerBase[10])
                                          (pPVar36,(ulong)pcVar47 & 0xffffffff,&drvInfo);
                              }
                              else {
                                result._M_dataplus._M_p._0_4_ = (uint)_Var14._M_p;
                                uVar24 = (uint)result._M_dataplus._M_p;
                                result._M_dataplus._M_p._2_1_ = (char)((ulong)_Var14._M_p >> 0x10);
                                if (result._M_dataplus._M_p._2_1_ != '\0' || sVar18 != 0x434c) {
                                  if (sVar18 == 0x4f) {
                                    uVar46 = strtoul((char *)psVar48,(char **)&local_1c8,0);
                                    local_c8._0_4_ = (int)uVar46;
                                  }
                                  else if (uVar24 == 0x4d5253) {
                                    uVar46 = strtoul((char *)psVar48,(char **)&local_1c8,0);
                                    uStack_d0 = CONCAT71(uStack_d0._1_7_,(char)uVar46);
                                  }
                                  else if (result._M_dataplus._M_p._2_1_ == '\0' && sVar18 == 0x5253
                                          ) {
                                    uVar46 = strtoul((char *)psVar48,(char **)&local_1c8,0);
                                    uStack_d0 = CONCAT44((int)uVar46,(UINT32)uStack_d0);
                                  }
                                  else {
                                    if (uVar24 != 0x4d5352) {
                                      if (sVar18 == 0x50) {
                                        uVar46 = 0;
                                        psVar43 = (string *)strtok((char *)0x0,",");
                                        if (psVar43 != (string *)0x0) {
                                          uVar54 = 0;
                                          do {
                                            dVar5 = strtod((char *)psVar43,(char **)&local_1c8);
                                            if (psVar43 < local_1c8) {
                                              *(short *)((long)&uStack_b8 + uVar54 * 2) =
                                                   (short)(int)(dVar5 * 256.0);
                                            }
                                            psVar43 = (string *)strtok((char *)0x0,",");
                                            uVar46 = uVar54 + 1;
                                          } while ((psVar43 != (string *)0x0) &&
                                                  (bVar58 = uVar54 < 0x1f, uVar54 = uVar46, bVar58))
                                          ;
                                        }
                                        (*pPVar36->_vptr_PlayerBase[10])
                                                  (pPVar36,(ulong)pcVar47 & 0xffffffff,&drvInfo);
                                        printf("-> Panning: ");
                                        if ((int)uVar46 != 0) {
                                          local_1c0 = (char *)(uVar46 & 0xffffffff);
                                          do {
                                            printf("%.2f,",SUB84((double)((float)(int)*(short *)((
                                                  long)&uStack_b8 + (long)local_1c0 * 2) *
                                                  0.00390625),0));
                                            uVar24 = (int)uVar46 - 1;
                                            uVar46 = (ulong)uVar24;
                                          } while (uVar24 != 0);
                                        }
                                        puts("\b ");
                                        iVar51 = 1;
                                      }
                                      else if ((uVar24 & 0xffff) == 0x4d) {
                                        psVar43 = (string *)strtok((char *)0x0,",");
                                        while (psVar43 != (string *)0x0) {
                                          iVar51 = toupper((uint)*(byte *)&(psVar43->_M_dataplus).
                                                                           _M_p);
                                          if (iVar51 < 0x4f) {
                                            if (iVar51 == 0x44) {
                                              local_c8._4_1_ = 0xff;
                                            }
                                            else if (iVar51 == 0x45) {
                                              local_c8._4_1_ = 0;
                                            }
                                            else {
LAB_0010ea88:
                                              iVar51 = isalnum(iVar51);
                                              if ((iVar51 != 0) &&
                                                 (lVar56 = strtol((char *)psVar43,
                                                                  (char **)&local_1c8,0),
                                                 psVar43 < local_1c8)) {
                                                local_c8.drvName =
                                                     (char *)CONCAT44(local_c8.drvName._4_4_,
                                                                      (uint)local_c8.drvName ^
                                                                      1 << ((byte)lVar56 & 0x1f));
                                              }
                                            }
                                          }
                                          else if (iVar51 == 0x4f) {
                                            local_c8.drvName =
                                                 (char *)((ulong)local_c8.drvName._4_4_ << 0x20);
                                          }
                                          else {
                                            if (iVar51 != 0x58) goto LAB_0010ea88;
                                            local_c8.drvName =
                                                 (char *)CONCAT44(local_c8.drvName._4_4_,0xffffffff)
                                            ;
                                          }
                                          psVar43 = (string *)strtok((char *)0x0,",");
                                        }
                                        (*pPVar36->_vptr_PlayerBase[0xc])
                                                  (pPVar36,(ulong)pcVar47 & 0xffffffff,
                                                   &local_c8.field_0x4);
                                        pcVar33 = "Off";
                                        if ((local_c8._0_8_ & 0x100000000) == 0) {
                                          pcVar33 = "On";
                                        }
                                        printf("-> Chip %s [0x%02X], Channel Mask: 0x%02X\n",pcVar33
                                              );
                                        iVar51 = 1;
                                      }
                                      else {
                                        iVar51 = -(uint)(sVar18 == 0x51);
                                      }
                                      goto LAB_0010ec3a;
                                    }
                                    uVar46 = strtoul((char *)psVar48,(char **)&local_1c8,0);
                                    uStack_d0._0_2_ = CONCAT11((char)uVar46,(UINT8)uStack_d0);
                                  }
                                  iVar51 = 1;
                                  if (psVar48 < local_1c8) {
                                    (*pPVar36->_vptr_PlayerBase[10])
                                              (pPVar36,(ulong)pcVar47 & 0xffffffff,&drvInfo);
                                  }
                                  goto LAB_0010ec3a;
                                }
                                diList.
                                super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                                _M_impl.super__Vector_impl_data._M_start =
                                     (pointer)&diList.
                                               super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                sVar42 = strlen((char *)psVar48);
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&diList,psVar48,
                                           (long)&(psVar48->_M_dataplus)._M_p + sVar42);
                                std::__cxx11::string::resize((ulong)&diList,'\x04');
                                drvInfo = (AUDDRV_INFO *)
                                          CONCAT44((int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 3
                                                  ) | (int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 2
                                                  ) << 8 | (int)*(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 1
                                                  ) << 0x10 |
                                                  (uint)(byte)(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id <<
                                                  0x18,(int)drvInfo);
                                (*pPVar36->_vptr_PlayerBase[10])
                                          (pPVar36,(ulong)pcVar47 & 0xffffffff,&drvInfo);
                              }
                              if (diList.
                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                                  _M_impl.super__Vector_impl_data._M_start !=
                                  (pointer)&diList.
                                            super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                                operator_delete(diList.
                                                super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                (ulong)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->id + 1));
                              }
                              iVar51 = 1;
                            }
                            else if (iVar51 == 10) {
                              printf("Command [T/FI/LL/TD data]: ");
                              fgets((char *)psVar43,0x80,_stdin);
                              psVar48 = (string *)(local_180 + 7);
                              do {
                                p_Var13 = &psVar48->_M_dataplus;
                                psVar48 = (string *)((long)&(psVar48->_M_dataplus)._M_p + 1);
                              } while (*(char *)((long)&p_Var13->_M_p + 1) != '\0');
                              do {
                                psVar49 = psVar48;
                                if (psVar49 <= psVar43) break;
                                iVar51 = iscntrl((uint)(byte)psVar49[-1].field_2._M_local_buf[0xf]);
                                psVar48 = (string *)((long)&psVar49[-1].field_2 + 0xf);
                              } while (iVar51 != 0);
                              *(undefined1 *)&(psVar49->_M_dataplus)._M_p = 0;
                              strtok((char *)psVar43," ");
                              bVar21 = (byte)result._M_dataplus._M_p;
                              _Var14 = result._M_dataplus;
                              while (result._M_dataplus._M_p = _Var14._M_p, bVar21 != 0) {
                                iVar51 = toupper((uint)bVar21);
                                *(char *)&(psVar43->_M_dataplus)._M_p = (char)iVar51;
                                p_Var13 = &psVar43->_M_dataplus;
                                psVar43 = (string *)((long)&(psVar43->_M_dataplus)._M_p + 1);
                                _Var14 = result._M_dataplus;
                                bVar21 = *(byte *)((long)&p_Var13->_M_p + 1);
                              }
                              psVar48 = (string *)((long)&(psVar43->_M_dataplus)._M_p + 1);
                              result._M_dataplus._M_p._0_2_ = (short)_Var14._M_p;
                              local_1c8 = psVar43;
                              if (((short)result._M_dataplus._M_p == 0x54) ||
                                 (result._M_dataplus._M_p._2_1_ = (char)((ulong)_Var14._M_p >> 0x10)
                                 , result._M_dataplus._M_p._2_1_ == '\0' &&
                                   (short)result._M_dataplus._M_p == 0x4946)) {
                                lVar56 = strtol((char *)psVar48,(char **)&local_1c8,0);
                                iVar26 = (int)lVar56;
                                if (local_1c8 == psVar48) {
                                  bVar21 = *(byte *)&(psVar48->_M_dataplus)._M_p;
                                  if (bVar21 == 0) {
LAB_0010e405:
                                    iVar26 = strcmp((char *)psVar48,"OFF");
                                    iVar51 = 10;
                                    if (iVar26 != 0) goto LAB_0010ec3a;
                                  }
                                  else {
                                    psVar49 = (string *)((long)&(psVar43->_M_dataplus)._M_p + 2);
                                    do {
                                      psVar53 = psVar49;
                                      iVar51 = toupper((uint)bVar21);
                                      psVar53[-1].field_2._M_local_buf[0xf] = (char)iVar51;
                                      bVar21 = *(byte *)&(psVar53->_M_dataplus)._M_p;
                                      psVar49 = (string *)((long)&(psVar53->_M_dataplus)._M_p + 1);
                                      local_1c8 = psVar53;
                                    } while (bVar21 != 0);
                                    cVar50 = *(char *)&(psVar48->_M_dataplus)._M_p;
                                    if (cVar50 != 'D') {
                                      iVar26 = 1;
                                      if ((cVar50 == 'E') ||
                                         (((cVar50 == 'O' &&
                                           (*(char *)((long)&(psVar43->_M_dataplus)._M_p + 2) == 'N'
                                           )) && (*(char *)((long)&(psVar43->_M_dataplus)._M_p + 3)
                                                  == '\0')))) goto LAB_0010e8ba;
                                      goto LAB_0010e405;
                                    }
                                  }
                                  iVar26 = 0;
LAB_0010e8ba:
                                  if ((short)result._M_dataplus._M_p != 0x54) {
                                    bVar58 = result._M_dataplus._M_p._2_1_ == '\0';
                                    bVar7 = (short)result._M_dataplus._M_p == 0x4946;
                                    iVar51 = 10;
                                    if (bVar58 && bVar7) {
                                      showFileInfo = iVar26 != 0;
                                    }
                                    goto LAB_0010ec3a;
                                  }
                                  showTags = (UINT8)iVar26;
                                }
                                else if (-1 < iVar26) goto LAB_0010e8ba;
                                iVar51 = 10;
                              }
                              else if (result._M_dataplus._M_p._2_1_ == '\0' &&
                                       (short)result._M_dataplus._M_p == 0x4c4c) {
                                uVar46 = strtoul((char *)psVar48,(char **)&local_1c8,0);
                                iVar51 = 10;
                                if (psVar48 < local_1c8) {
                                  logLevel = (UINT8)uVar46;
                                }
                              }
                              else if (result._M_dataplus._M_p._2_1_ == '\0' &&
                                       (short)result._M_dataplus._M_p == 0x4454) {
                                uVar46 = strtoul((char *)psVar48,(char **)&local_1c8,0);
                                iVar51 = 10;
                                if (psVar48 < local_1c8) {
                                  pbTimeMode = (UINT8)uVar46;
                                }
                              }
                              else {
                                iVar51 = -(uint)((short)result._M_dataplus._M_p == 0x51);
                              }
                            }
                            else if (iVar51 == 2) {
                              iVar51 = (*pPVar36->_vptr_PlayerBase[2])(pPVar36);
                              if (iVar51 < 0x53393800) {
                                if (iVar51 == 0x44524f00) {
                                  pDVar30 = (DROPlayer *)
                                            __dynamic_cast(pPVar36,&PlayerBase::typeinfo,
                                                           &DROPlayer::typeinfo);
                                  DROPlayer::GetPlayerOptions(pDVar30,(DRO_PLAY_OPTIONS *)&drvInfo);
                                  printf("Command [SPD/OPL3 data]: ");
                                  fgets((char *)psVar43,0x80,_stdin);
                                  psVar43 = (string *)(local_180 + 7);
                                  do {
                                    p_Var13 = &psVar43->_M_dataplus;
                                    psVar43 = (string *)((long)&(psVar43->_M_dataplus)._M_p + 1);
                                  } while (*(char *)((long)&p_Var13->_M_p + 1) != '\0');
                                  do {
                                    psVar48 = psVar43;
                                    if (psVar48 <= &result) break;
                                    iVar51 = iscntrl((uint)(byte)psVar48[-1].field_2._M_local_buf
                                                                 [0xf]);
                                    psVar43 = (string *)((long)&psVar48[-1].field_2 + 0xf);
                                  } while (iVar51 != 0);
                                  *(undefined1 *)&(psVar48->_M_dataplus)._M_p = 0;
                                  psVar43 = &result;
                                  strtok((char *)psVar43," ");
                                  if ((byte)result._M_dataplus._M_p != 0) {
                                    psVar43 = &result;
                                    bVar21 = (byte)result._M_dataplus._M_p;
                                    do {
                                      iVar51 = toupper((uint)bVar21);
                                      *(char *)&(psVar43->_M_dataplus)._M_p = (char)iVar51;
                                      bVar21 = *(byte *)((long)&(psVar43->_M_dataplus)._M_p + 1);
                                      psVar43 = (string *)((long)&(psVar43->_M_dataplus)._M_p + 1);
                                    } while (bVar21 != 0);
                                  }
                                  psVar48 = (string *)((long)&(psVar43->_M_dataplus)._M_p + 1);
                                  local_1c8 = psVar43;
                                  if ((uint)result._M_dataplus._M_p != 0x445053) {
                                    if (result._M_dataplus._M_p._4_1_ == '\0' &&
                                        (uint)result._M_dataplus._M_p == 0x334c504f) {
                                      uVar46 = strtoul((char *)psVar48,(char **)&local_1c8,0);
                                      drvInfo._0_5_ = CONCAT14((char)uVar46,(int)drvInfo);
                                      iVar51 = 2;
                                      if (psVar48 < local_1c8) {
                                        DROPlayer::SetPlayerOptions
                                                  (pDVar30,(DRO_PLAY_OPTIONS *)&drvInfo);
                                      }
                                      goto LAB_0010ec3a;
                                    }
                                    goto LAB_0010e772;
                                  }
LAB_0010e50f:
                                  dVar5 = strtod((char *)psVar48,(char **)&local_1c8);
                                  iVar51 = 2;
                                  if (psVar48 < local_1c8) {
                                    (*(pDVar30->super_PlayerBase)._vptr_PlayerBase[0x11])
                                              (SUB84(dVar5,0),pDVar30);
                                  }
                                }
                                else if (iVar51 == 0x47594d00) {
                                  pDVar30 = (DROPlayer *)
                                            __dynamic_cast(pPVar36,&PlayerBase::typeinfo,
                                                           &GYMPlayer::typeinfo);
                                  GYMPlayer::GetPlayerOptions
                                            ((GYMPlayer *)pDVar30,(GYM_PLAY_OPTIONS *)&drvInfo);
                                  printf("Command [SPD data]: ");
                                  fgets((char *)psVar43,0x80,_stdin);
                                  psVar43 = (string *)(local_180 + 7);
                                  do {
                                    p_Var13 = &psVar43->_M_dataplus;
                                    psVar43 = (string *)((long)&(psVar43->_M_dataplus)._M_p + 1);
                                  } while (*(char *)((long)&p_Var13->_M_p + 1) != '\0');
                                  do {
                                    psVar48 = psVar43;
                                    if (psVar48 <= &result) break;
                                    iVar51 = iscntrl((uint)(byte)psVar48[-1].field_2._M_local_buf
                                                                 [0xf]);
                                    psVar43 = (string *)((long)&psVar48[-1].field_2 + 0xf);
                                  } while (iVar51 != 0);
                                  *(undefined1 *)&(psVar48->_M_dataplus)._M_p = 0;
                                  psVar43 = &result;
                                  strtok((char *)psVar43," ");
                                  if ((byte)result._M_dataplus._M_p != 0) {
                                    psVar43 = &result;
                                    bVar21 = (byte)result._M_dataplus._M_p;
                                    do {
                                      iVar51 = toupper((uint)bVar21);
                                      *(char *)&(psVar43->_M_dataplus)._M_p = (char)iVar51;
                                      bVar21 = *(byte *)((long)&(psVar43->_M_dataplus)._M_p + 1);
                                      psVar43 = (string *)((long)&(psVar43->_M_dataplus)._M_p + 1);
                                    } while (bVar21 != 0);
                                  }
                                  local_1c8 = psVar43;
                                  if ((uint)result._M_dataplus._M_p == 0x445053) {
                                    psVar48 = (string *)((long)&(psVar43->_M_dataplus)._M_p + 1);
                                    goto LAB_0010e50f;
                                  }
LAB_0010e772:
                                  iVar51 = -(uint)((short)(uint)result._M_dataplus._M_p == 0x51);
                                }
                                else {
LAB_0010e428:
                                  puts("No player-specific configuration available.");
LAB_0010e434:
                                  iVar51 = 0;
                                }
                              }
                              else if (iVar51 == 0x53393800) {
                                pVVar28 = (VGMPlayer *)
                                          __dynamic_cast(pPVar36,&PlayerBase::typeinfo,
                                                         &S98Player::typeinfo);
                                S98Player::GetPlayerOptions
                                          ((S98Player *)pVVar28,(S98_PLAY_OPTIONS *)&drvInfo);
                                printf("Command [SPD data]: ");
                                fgets((char *)psVar43,0x80,_stdin);
                                psVar43 = (string *)(local_180 + 7);
                                do {
                                  p_Var13 = &psVar43->_M_dataplus;
                                  psVar43 = (string *)((long)&(psVar43->_M_dataplus)._M_p + 1);
                                } while (*(char *)((long)&p_Var13->_M_p + 1) != '\0');
                                do {
                                  psVar48 = psVar43;
                                  if (psVar48 <= &result) break;
                                  iVar51 = iscntrl((uint)(byte)psVar48[-1].field_2._M_local_buf[0xf]
                                                  );
                                  psVar43 = (string *)((long)&psVar48[-1].field_2 + 0xf);
                                } while (iVar51 != 0);
                                *(undefined1 *)&(psVar48->_M_dataplus)._M_p = 0;
                                psVar43 = &result;
                                strtok((char *)psVar43," ");
                                if ((byte)result._M_dataplus._M_p != 0) {
                                  psVar43 = &result;
                                  bVar21 = (byte)result._M_dataplus._M_p;
                                  do {
                                    iVar51 = toupper((uint)bVar21);
                                    *(char *)&(psVar43->_M_dataplus)._M_p = (char)iVar51;
                                    bVar21 = *(byte *)((long)&(psVar43->_M_dataplus)._M_p + 1);
                                    psVar43 = (string *)((long)&(psVar43->_M_dataplus)._M_p + 1);
                                  } while (bVar21 != 0);
                                }
                                local_1c8 = psVar43;
                                if ((uint)result._M_dataplus._M_p == 0x445053) {
                                  psVar43 = (string *)((long)&(psVar43->_M_dataplus)._M_p + 1);
LAB_0010e60e:
                                  dVar5 = strtod((char *)psVar43,(char **)&local_1c8);
                                  iVar51 = 2;
                                  if (psVar43 < local_1c8) {
                                    (*(pVVar28->super_PlayerBase)._vptr_PlayerBase[0x11])
                                              (SUB84(dVar5,0),pVVar28);
                                  }
                                }
                                else {
LAB_0010e723:
                                  iVar51 = -(uint)((short)(uint)result._M_dataplus._M_p == 0x51);
                                }
                              }
                              else {
                                if (iVar51 != 0x56474d00) goto LAB_0010e428;
                                pVVar28 = (VGMPlayer *)
                                          __dynamic_cast(pPVar36,&PlayerBase::typeinfo,
                                                         &VGMPlayer::typeinfo);
                                VGMPlayer::GetPlayerOptions(pVVar28,(VGM_PLAY_OPTIONS *)&drvInfo);
                                printf("Command [SPD/PHZ/HSO data]: ");
                                fgets((char *)psVar43,0x80,_stdin);
                                psVar43 = (string *)(local_180 + 7);
                                do {
                                  p_Var13 = &psVar43->_M_dataplus;
                                  psVar43 = (string *)((long)&(psVar43->_M_dataplus)._M_p + 1);
                                } while (*(char *)((long)&p_Var13->_M_p + 1) != '\0');
                                do {
                                  psVar48 = psVar43;
                                  if (psVar48 <= &result) break;
                                  iVar51 = iscntrl((uint)(byte)psVar48[-1].field_2._M_local_buf[0xf]
                                                  );
                                  psVar43 = (string *)((long)&psVar48[-1].field_2 + 0xf);
                                } while (iVar51 != 0);
                                *(undefined1 *)&(psVar48->_M_dataplus)._M_p = 0;
                                psVar48 = &result;
                                strtok((char *)psVar48," ");
                                if ((byte)result._M_dataplus._M_p != 0) {
                                  psVar48 = &result;
                                  bVar21 = (byte)result._M_dataplus._M_p;
                                  do {
                                    iVar51 = toupper((uint)bVar21);
                                    *(char *)&(psVar48->_M_dataplus)._M_p = (char)iVar51;
                                    bVar21 = *(byte *)((long)&(psVar48->_M_dataplus)._M_p + 1);
                                    psVar48 = (string *)((long)&(psVar48->_M_dataplus)._M_p + 1);
                                  } while (bVar21 != 0);
                                }
                                psVar43 = (string *)((long)&(psVar48->_M_dataplus)._M_p + 1);
                                local_1c8 = psVar48;
                                if ((uint)result._M_dataplus._M_p == 0x5a4850) {
                                  uVar46 = strtoul((char *)psVar43,(char **)&local_1c8,0);
                                  drvInfo = (AUDDRV_INFO *)CONCAT44((int)uVar46,(int)drvInfo);
                                }
                                else {
                                  if ((uint)result._M_dataplus._M_p != 0x4f5348) {
                                    if ((uint)result._M_dataplus._M_p != 0x445053)
                                    goto LAB_0010e723;
                                    goto LAB_0010e60e;
                                  }
                                  uVar46 = strtoul((char *)psVar43,(char **)&local_1c8,0);
                                  uStack_d0 = CONCAT71(uStack_d0._1_7_,(char)uVar46);
                                }
                                iVar51 = 2;
                                if (psVar43 < local_1c8) {
                                  iVar51 = 2;
                                  VGMPlayer::SetPlayerOptions(pVVar28,(VGM_PLAY_OPTIONS *)&drvInfo);
                                }
                              }
                            }
                            else if (iVar51 == 0) {
                              printf("Sound Chip ID: ");
                              fgets((char *)psVar43,0x80,_stdin);
                              psVar48 = (string *)(local_180 + 7);
                              do {
                                p_Var13 = &psVar48->_M_dataplus;
                                psVar48 = (string *)((long)&(psVar48->_M_dataplus)._M_p + 1);
                              } while (*(char *)((long)&p_Var13->_M_p + 1) != '\0');
                              do {
                                psVar49 = psVar48;
                                if (psVar49 <= psVar43) break;
                                iVar51 = iscntrl((uint)(byte)psVar49[-1].field_2._M_local_buf[0xf]);
                                psVar48 = (string *)((long)&psVar49[-1].field_2 + 0xf);
                              } while (iVar51 != 0);
                              *(undefined1 *)&(psVar49->_M_dataplus)._M_p = 0;
                              if ((byte)result._M_dataplus._M_p == '\0') break;
                              pcVar47 = (char *)strtoul((char *)psVar43,(char **)&local_1c8,0);
                              if (psVar43 < local_1c8) {
                                local_1c0 = pcVar47;
                                iVar51 = (*pPVar36->_vptr_PlayerBase[0xb])(pPVar36,pcVar47,&drvInfo)
                                ;
                                pAVar19 = drvInfo;
                                if ((char)iVar51 < '\0') {
                                  puts("Invalid sound chip ID.");
                                  iVar51 = 0;
                                  pcVar47 = local_1c0;
                                }
                                else {
                                  ppPVar1 = &diList.
                                             super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                  diList.
                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>.
                                  _M_impl.super__Vector_impl_data._M_start = (pointer)ppPVar1;
                                  std::__cxx11::string::_M_construct((ulong)&diList,'\x04');
                                  *(char *)&(diList.
                                             super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->id =
                                       (char)((ulong)pAVar19 >> 0x18);
                                  *(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 1
                                           ) = (char)((ulong)pAVar19 >> 0x10);
                                  *(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 2
                                           ) = (char)((ulong)pAVar19 >> 8);
                                  *(char *)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id + 3
                                           ) = (char)pAVar19;
                                  printf("Cfg: Core %s, Opts 0x%X, srMode 0x%02X, sRate %u, resampleMode 0x%02X\n"
                                         ,diList.
                                          super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                         local_c8._0_8_ & 0xffffffff,uStack_d0 & 0xff,
                                         uStack_d0 >> 0x20,uStack_d0 >> 8 & 0xff);
                                  if (diList.
                                      super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppPVar1)
                                  {
                                    operator_delete(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (ulong)((long)&(diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->id + 1));
                                  }
                                  pcVar47 = "Off";
                                  if ((local_c8._0_8_ & 0x100000000) == 0) {
                                    pcVar47 = "On";
                                  }
                                  printf("Muting: Chip %s [0x%02X], Channel Mask: 0x%02X\n",pcVar47)
                                  ;
                                  iVar51 = 1;
                                  pcVar47 = local_1c0;
                                }
                              }
                              else {
                                iVar51 = toupper((uint)(byte)result._M_dataplus._M_p);
                                if (iVar51 == 0x44) {
                                  iVar51 = 10;
                                }
                                else {
                                  if (iVar51 != 0x50) goto LAB_0010e434;
                                  iVar26 = (*pPVar36->_vptr_PlayerBase[2])(pPVar36);
                                  iVar51 = 0;
                                  if (iVar26 < 0x53393800) {
                                    if (iVar26 == 0x44524f00) {
                                      pDVar30 = (DROPlayer *)
                                                __dynamic_cast(pPVar36,&PlayerBase::typeinfo,
                                                               &DROPlayer::typeinfo);
                                      DROPlayer::GetPlayerOptions
                                                (pDVar30,(DRO_PLAY_OPTIONS *)&diList);
                                      printf("Opts: Speed %.3f, OPL3Mode %u\n",
                                             SUB84((double)((ulong)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                                  0xffffffff) * 1.52587890625e-05,0),
                                             (ulong)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 0x20
                                             & 0xff);
                                    }
                                    else {
                                      iVar51 = 0;
                                      if (iVar26 != 0x47594d00) goto LAB_0010ec3a;
                                      pGVar31 = (GYMPlayer *)
                                                __dynamic_cast(pPVar36,&PlayerBase::typeinfo,
                                                               &GYMPlayer::typeinfo);
                                      GYMPlayer::GetPlayerOptions
                                                (pGVar31,(GYM_PLAY_OPTIONS *)&diList);
LAB_0010e9ad:
                                      printf("Opts: Speed %.3f\n",
                                             SUB84((double)((ulong)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                                  0xffffffff) * 1.52587890625e-05,0));
                                    }
                                  }
                                  else {
                                    if (iVar26 == 0x53393800) {
                                      pSVar29 = (S98Player *)
                                                __dynamic_cast(pPVar36,&PlayerBase::typeinfo,
                                                               &S98Player::typeinfo);
                                      S98Player::GetPlayerOptions
                                                (pSVar29,(S98_PLAY_OPTIONS *)&diList);
                                      goto LAB_0010e9ad;
                                    }
                                    if (iVar26 != 0x56474d00) goto LAB_0010ec3a;
                                    pVVar28 = (VGMPlayer *)
                                              __dynamic_cast(pPVar36,&PlayerBase::typeinfo,
                                                             &VGMPlayer::typeinfo);
                                    VGMPlayer::GetPlayerOptions(pVVar28,(VGM_PLAY_OPTIONS *)&diList)
                                    ;
                                    printf("Opts: Speed %.3f, PlaybkHz %u, HardStopOld %u\n",
                                           SUB84((double)((ulong)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                                  0xffffffff) * 1.52587890625e-05,0),
                                           (ulong)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 0x20,
                                           (ulong)diList.
                                                  super__Vector_base<PLR_DEV_INFO,_std::allocator<PLR_DEV_INFO>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish & 0xff)
                                    ;
                                  }
                                  iVar51 = 2;
                                }
                              }
                            }
LAB_0010ec3a:
                          } while (-1 < iVar51);
                          drvStruct = (FILE *)0x1;
                          changemode('\x01');
                        }
                        else if (uVar25 == 0x46) {
                          OSMutex_Lock(renderMtx);
                          PlayerA::FadeOut(&mainPlr);
                          goto LAB_0010dc2e;
                        }
                      }
                    }
LAB_0010dca0:
                  } while ((playState & 2) == 0);
                  changemode('\0');
                  if (audDrv != (void *)0x0) {
                    AudioDrv_SetCallback(audDrv,(AUDFUNC_FILLBUF)0x0,(void *)0x0);
                  }
                  pDVar35 = local_38;
                  auVar52 = local_180;
                  if (audDrvLog != (void *)0x0) {
                    if (audDrv != (void *)0x0) {
                      AudioDrv_DataForward_Remove(audDrv,audDrvLog);
                    }
                    AudioDrv_Stop(audDrvLog);
                  }
                  PlayerA::Stop(&mainPlr);
                  PlayerA::UnloadFile(&mainPlr);
                  DataLoader_Deinit(pDVar35);
                }
                else {
                  main_cold_4();
                }
              }
              else {
                main_cold_3();
              }
            }
            uVar23 = SUB84(auVar52,0) + 1;
            auVar52 = (undefined1  [8])(ulong)uVar23;
            if (argc <= (int)uVar23) {
              PlayerA::UnregisterAllPlayers(&mainPlr);
              if (audDrv != (void *)0x0) {
                AudioDrv_Stop(audDrv);
              }
              if (locAudBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  locAudBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                locAudBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     locAudBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
              }
              DeinitAudioSystem();
              puts("Done.");
              return 0;
            }
          } while( true );
        }
LAB_0010ed63:
        DeinitAudioSystem();
        return 1;
      }
      main_cold_1();
      goto LAB_0010ed54;
    }
  }
  main_cold_5();
LAB_0010ed54:
  Audio_Deinit();
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
	int argbase;
	UINT8 retVal;
	DATA_LOADER *dLoad;
	int curSong;
	bool needRefresh;
	
	if (argc < 2)
	{
		printf("Usage: %s inputfile\n", argv[0]);
		return 0;
	}
	argbase = 1;
#ifdef _WIN32
	SetConsoleOutputCP(65001);	// set UTF-8 codepage
#endif
	
	retVal = InitAudioSystem();
	if (retVal)
		return 1;
	retVal = StartAudioDevice();
	if (retVal)
	{
		DeinitAudioSystem();
		return 1;
	}
	playState = 0x00;
	
	// I'll keep the instances of the players for the program's life time.
	// This way player/chip options are kept between track changes.
	mainPlr.RegisterPlayerEngine(new VGMPlayer);
	mainPlr.RegisterPlayerEngine(new S98Player);
	mainPlr.RegisterPlayerEngine(new DROPlayer);
	mainPlr.RegisterPlayerEngine(new GYMPlayer);
	mainPlr.SetEventCallback(FilePlayCallback, NULL);
	mainPlr.SetFileReqCallback(RequestFileCallback, NULL);
	mainPlr.SetLogCallback(PlayerLogCallback, NULL);
	//mainPlr.SetOutputSettings() is done in StartAudioDevice()
	{
		PlayerA::Config pCfg = mainPlr.GetConfiguration();
		pCfg.masterVol = masterVol;
		pCfg.loopCount = maxLoops;
		pCfg.fadeSmpls = sampleRate * 4;	// fade over 4 seconds
		pCfg.endSilenceSmpls = sampleRate / 2;	// 0.5 seconds of silence at the end
		pCfg.pbSpeed = 1.0;
		mainPlr.SetConfiguration(pCfg);
	}

	for (curSong = argbase; curSong < argc; curSong ++)
	{
	
	printf("Loading %s ...  ", GetFileTitle(argv[curSong]));
	fflush(stdout);

#ifdef USE_MEMORY_LOADER
	UINT32 fileSize;
	UINT8 *fileData = SlurpFile(argv[curSong],&fileSize);
	dLoad = MemoryLoader_Init(fileData, fileSize);
#else
	dLoad = FileLoader_Init(argv[curSong]);
#endif

	if(dLoad == NULL) continue;
	DataLoader_SetPreloadBytes(dLoad,0x100);
	retVal = DataLoader_Load(dLoad);
	if (retVal)
	{
		DataLoader_Deinit(dLoad);
		fprintf(stderr, "Error 0x%02X loading file!\n", retVal);
		continue;
	}
	retVal = mainPlr.LoadFile(dLoad);
	if (retVal)
	{
		DataLoader_Deinit(dLoad);
		fprintf(stderr, "Error 0x%02X loading file!\n", retVal);
		continue;
	}
	
	PlayerBase* player = mainPlr.GetPlayer();
	mainPlr.SetLoopCount(maxLoops);
	if (player->GetPlayerType() == FCC_S98)
	{
		S98Player* s98play = dynamic_cast<S98Player*>(player);
		const S98_HEADER* s98hdr = s98play->GetFileHeader();
		
		printf("S98 v%u, Total Length: %.2f s, Loop Length: %.2f s, Tick Rate: %u/%u", s98hdr->fileVer,
				player->Tick2Second(player->GetTotalTicks()), player->Tick2Second(player->GetLoopTicks()),
				s98hdr->tickMult, s98hdr->tickDiv);
	}
	else if (player->GetPlayerType() == FCC_VGM)
	{
		VGMPlayer* vgmplay = dynamic_cast<VGMPlayer*>(player);
		const VGM_HEADER* vgmhdr = vgmplay->GetFileHeader();
		
		printf("VGM v%3X, Total Length: %.2f s, Loop Length: %.2f s", vgmhdr->fileVer,
				player->Tick2Second(player->GetTotalTicks()), player->Tick2Second(player->GetLoopTicks()));
		mainPlr.SetLoopCount(vgmplay->GetModifiedLoopCount(maxLoops));
	}
	else if (player->GetPlayerType() == FCC_DRO)
	{
		DROPlayer* droplay = dynamic_cast<DROPlayer*>(player);
		const DRO_HEADER* drohdr = droplay->GetFileHeader();
		const char* hwType;
		
		if (drohdr->hwType == 0)
			hwType = "OPL2";
		else if (drohdr->hwType == 1)
			hwType = "DualOPL2";
		else if (drohdr->hwType == 2)
			hwType = "OPL3";
		else
			hwType = "unknown";
		printf("DRO v%u, Total Length: %.2f s, HW Type: %s", drohdr->verMajor,
				player->Tick2Second(player->GetTotalTicks()), hwType);
	}
	
	if (showTags > 0)
	{
		const char* songTitle = NULL;
		const char* songAuthor = NULL;
		const char* songGame = NULL;
		const char* songSystem = NULL;
		const char* songDate = NULL;
		const char* songComment = NULL;
	
		const char* const* tagList = player->GetTags();
		for (const char* const* t = tagList; *t; t += 2)
		{
			if (!strcmp(t[0], "TITLE"))
				songTitle = t[1];
			else if (!strcmp(t[0], "ARTIST"))
				songAuthor = t[1];
			else if (!strcmp(t[0], "GAME"))
				songGame = t[1];
			else if (!strcmp(t[0], "SYSTEM"))
				songSystem = t[1];
			else if (!strcmp(t[0], "DATE"))
				songDate = t[1];
			else if (!strcmp(t[0], "COMMENT"))
				songComment = t[1];
		}
		
		if (songTitle != NULL && songTitle[0] != '\0')
			printf("\nSong Title: %s", songTitle);
		if (showTags >= 2)
		{
			if (songAuthor != NULL && songAuthor[0] != '\0')
				printf("\nSong Author: %s", songAuthor);
			if (songGame != NULL && songGame[0] != '\0')
				printf("\nSong Game: %s", songGame);
			if (songSystem != NULL && songSystem[0] != '\0')
				printf("\nSong System: %s", songSystem);
			if (songDate != NULL && songDate[0] != '\0')
				printf("\nSong Date: %s", songDate);
			if (songComment != NULL && songComment[0] != '\0')
				printf("\nSong Comment: %s", songComment);
		}
	}
	
	putchar('\n');
	
	{
		PLR_DEV_OPTS devOpts;
		UINT32 devOptID;
		
		devOptID = PLR_DEV_ID(DEVID_SN76496, 0);
		retVal = player->GetDeviceOptions(devOptID, devOpts);
		if (! (retVal & 0x80))
		{
			static const INT16 panPos[4] = {0x00, -0x80, +0x80, 0x00};
			if (! devOpts.emuCore[0])
				devOpts.emuCore[0] = FCC_MAXM;
			memcpy(devOpts.panOpts.chnPan, panPos, sizeof(panPos));
			player->SetDeviceOptions(devOptID, devOpts);
		}
		
		devOptID = PLR_DEV_ID(DEVID_YM2413, 0);
		retVal = player->GetDeviceOptions(devOptID, devOpts);
		if (! (retVal & 0x80))
		{
			static const INT16 panPos[14] = {
				-0x100, +0x100, -0x80, +0x80, -0x40, +0x40, -0xC0, +0xC0, 0x00,
				-0x60, +0x60, 0x00, -0xC0, +0xC0};
			memcpy(devOpts.panOpts.chnPan, panPos, sizeof(panPos));
			player->SetDeviceOptions(devOptID, devOpts);
		}
		
		devOptID = PLR_DEV_ID(DEVID_AY8910, 0);
		retVal = player->GetDeviceOptions(devOptID, devOpts);
		if (! (retVal & 0x80))
		{
			static const INT16 panPos[3] = {-0x80, +0x80, 0x00};
			memcpy(devOpts.panOpts.chnPan, panPos, sizeof(panPos));
			player->SetDeviceOptions(devOptID, devOpts);
		}

		devOptID = PLR_DEV_ID(DEVID_C6280, 0);
		retVal = player->GetDeviceOptions(devOptID, devOpts);
		if (! (retVal & 0x80))
		{
			if (! devOpts.emuCore[0])
				devOpts.emuCore[0] = FCC_MAME;
			player->SetDeviceOptions(devOptID, devOpts);
		}
	}
	
	mainPlr.Start();
	
	if (showFileInfo)
	{
		// only after calling PlayerA::Start() we can obtain info about the currently used sound cores
		PLR_SONG_INFO sInf;
		std::vector<PLR_DEV_INFO> diList;
		size_t curDev;
		
		player->GetSongInfo(sInf);
		player->GetSongDeviceInfo(diList);
		printf("SongInfo: %s v%X.%02X, Rate %u/%u, Len %u, Loop at %d, devices: %u\n",
			FCC2Str(sInf.format).c_str(), sInf.fileVerMaj, sInf.fileVerMin,
			sInf.tickRateMul, sInf.tickRateDiv, sInf.songLen, sInf.loopTick, sInf.deviceCnt);
		for (curDev = 0; curDev < diList.size(); curDev ++)
		{
			const PLR_DEV_INFO& pdi = diList[curDev];
			printf(" Dev %d: Type 0x%02X #%d, Core %s, Clock %u, Rate %u, Volume 0x%X\n",
				(int)pdi.id, pdi.type, (INT8)pdi.instance, FCC2Str(pdi.core).c_str(), pdi.devCfg->clock, pdi.smplRate, pdi.volume);
		}
	}
	const std::vector<VGMPlayer::DACSTRM_DEV>* vgmPcmStrms = NULL;
	if (player->GetPlayerType() == FCC_VGM)
	{
		VGMPlayer* vgmplay = dynamic_cast<VGMPlayer*>(player);
		vgmPcmStrms = &vgmplay->GetStreamDevInfo();
	}
	
	StartDiskWriter("waveOut.wav");
	
	if (audDrv != NULL)
		retVal = AudioDrv_SetCallback(audDrv, FillBuffer, &mainPlr);
	else
		retVal = 0xFF;
	manualRenderLoop = (retVal != 0x00);
#ifndef _WIN32
	changemode(1);
#endif
	playState &= ~PLAYSTATE_END;
	needRefresh = true;
	while(! (playState & PLAYSTATE_END))
	{
		if (! (playState & PLAYSTATE_PAUSE))
			needRefresh = true;	// always update when playing
		if (needRefresh)
		{
			const char* pState;
			
			if (playState & PLAYSTATE_PAUSE)
				pState = "Paused";
			else if (mainPlr.GetState() & PLAYSTATE_END)
				pState = "Finish ";
			else if (mainPlr.GetState() & PLAYSTATE_FADE)
				pState = "Fading ";
			else
				pState = "Playing";
			if (vgmPcmStrms == NULL || vgmPcmStrms->empty())
			{
				printf("%s %.2f / %.2f ...   \r", pState, mainPlr.GetCurTime(pbTimeMode), mainPlr.GetTotalTime(pbTimeMode));
			}
			else
			{
				const VGMPlayer::DACSTRM_DEV* strmDev = &(*vgmPcmStrms)[0];
				std::string pbMode = " ";
				if (strmDev->pbMode & 0x10)
					pbMode += 'R';	// reverse playback
				if (strmDev->pbMode & 0x80)
					pbMode += 'L';	// looping
				if (pbMode.length() == 1)
					pbMode = "";
				printf("%s %.2f / %.2f [%02X / %02X at %4.1f KHz%s] ...     \r",
					pState, mainPlr.GetCurTime(pbTimeMode), mainPlr.GetTotalTime(pbTimeMode),
					1 + strmDev->lastItem, strmDev->maxItems, strmDev->freq / 1000.0,
					pbMode.c_str());
			}
			fflush(stdout);
			needRefresh = false;
		}
		
		if (manualRenderLoop && ! (playState & PLAYSTATE_PAUSE))
		{
			UINT32 wrtBytes = FillBuffer(audDrvLog, &mainPlr, (UINT32)locAudBuf.size(), &locAudBuf[0]);
			AudioDrv_WriteData(audDrvLog, wrtBytes, &locAudBuf[0]);
		}
		else
		{
			Sleep(50);
		}
		
		if (_kbhit())
		{
			int inkey = _getch();
			int letter = toupper(inkey);
			
			if (letter == ' ' || letter == 'P')
			{
				playState ^= PLAYSTATE_PAUSE;
				if (audDrv != NULL)
				{
					if (playState & PLAYSTATE_PAUSE)
						AudioDrv_Pause(audDrv);
					else
						AudioDrv_Resume(audDrv);
				}
			}
			else if (letter == 'R')	// restart
			{
				OSMutex_Lock(renderMtx);
				mainPlr.Reset();
				OSMutex_Unlock(renderMtx);
			}
			else if (letter >= '0' && letter <= '9')
			{
				UINT32 maxPos;
				UINT8 pbPos10;
				UINT32 destPos;
				
				OSMutex_Lock(renderMtx);
				maxPos = mainPlr.GetPlayer()->GetTotalPlayTicks(maxLoops);
				pbPos10 = letter - '0';
				destPos = maxPos * pbPos10 / 10;
				mainPlr.Seek(PLAYPOS_TICK, destPos);
				OSMutex_Unlock(renderMtx);
			}
			else if (letter == 'B')	// previous file
			{
				if (curSong > argbase)
				{
					playState |= PLAYSTATE_END;
					curSong -= 2;
				}
			}
			else if (letter == 'N')	// next file
			{
				if (curSong + 1 < argc)
					playState |= PLAYSTATE_END;
			}
			else if (inkey == 0x1B || letter == 'Q')	// quit
			{
				playState |= PLAYSTATE_END;
				curSong = argc - 1;
			}
			else if (letter == 'F')	// fade out
			{
				OSMutex_Lock(renderMtx);
				mainPlr.FadeOut();
				OSMutex_Unlock(renderMtx);
			}
			else if (letter == 'C')	// chip control
			{
#ifndef _WIN32
				changemode(0);	// make sure entered charactered are echoed
#endif
				DoChipControlMode(mainPlr.GetPlayer());
#ifndef _WIN32
				changemode(1);
#endif
			}
			needRefresh = true;
		}
	}
#ifndef _WIN32
	changemode(0);
#endif
	// remove callback to prevent further rendering
	// also waits for render thread to finish its work
	if (audDrv != NULL)
		AudioDrv_SetCallback(audDrv, NULL, NULL);
	
	StopDiskWriter();
	
	mainPlr.Stop();
	mainPlr.UnloadFile();
	DataLoader_Deinit(dLoad);	dLoad = NULL;
#ifdef USE_MEMORY_LOADER
	free(fileData);
#endif
	
	}	// end for(curSong)
	
	mainPlr.UnregisterAllPlayers();
	
	StopAudioDevice();
	DeinitAudioSystem();
	printf("Done.\n");
	
#if defined(_DEBUG) && (_MSC_VER >= 1400)
	// doesn't work well with C++ containers
	//if (_CrtDumpMemoryLeaks())
	//	_getch();
#endif
	
	return 0;
}